

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O0

bool __thiscall
MT32Emu::Synth::initTimbres
          (Synth *this,Bit16u mapAddress,Bit16u offset,Bit16u count,Bit16u startTimbre,
          bool compressed)

{
  bool bVar1;
  ushort uVar2;
  ushort local_32;
  Bit16u address;
  Bit16u i;
  Bit8u *timbreMap;
  ushort local_20;
  bool compressed_local;
  Bit16u startTimbre_local;
  Bit16u count_local;
  Bit16u offset_local;
  Bit16u mapAddress_local;
  Synth *this_local;
  
  local_32 = 0;
  local_20 = startTimbre;
  while( true ) {
    if ((uint)count * 2 <= (uint)local_32) {
      return true;
    }
    uVar2 = CONCAT11(this->controlROMData
                     [(long)(int)(local_32 + 1) + (ulong)mapAddress + 0x60 + -0x60],
                     this->controlROMData[(ulong)local_32 + (ulong)mapAddress + 0x60 + -0x60]);
    if ((!compressed) && (0x10000 < (long)(int)((uint)uVar2 + (uint)offset) + 0xf6U)) break;
    uVar2 = uVar2 + offset;
    if (compressed) {
      bVar1 = initCompressedTimbre(this,local_20,this->controlROMData + uVar2,0x10000 - uVar2);
      if (!bVar1) {
        printDebug(this,
                   "Control ROM error: Timbre map entry 0x%04x for timbre %d points to invalid timbre at 0x%04x"
                   ,(ulong)local_32,(ulong)local_20,(ulong)uVar2);
        return false;
      }
    }
    else {
      MemoryRegion::write(&this->timbresMemoryRegion->super_MemoryRegion,(uint)local_20,(void *)0x0,
                          (size_t)(this->controlROMData + uVar2));
    }
    local_20 = local_20 + 1;
    local_32 = local_32 + 2;
  }
  printDebug(this,
             "Control ROM error: Timbre map entry 0x%04x for timbre %d points to invalid timbre address 0x%04x"
             ,(ulong)local_32,(ulong)local_20,(ulong)uVar2);
  return false;
}

Assistant:

bool Synth::initTimbres(Bit16u mapAddress, Bit16u offset, Bit16u count, Bit16u startTimbre, bool compressed) {
	const Bit8u *timbreMap = &controlROMData[mapAddress];
	for (Bit16u i = 0; i < count * 2; i += 2) {
		Bit16u address = (timbreMap[i + 1] << 8) | timbreMap[i];
		if (!compressed && (address + offset + sizeof(TimbreParam) > CONTROL_ROM_SIZE)) {
			printDebug("Control ROM error: Timbre map entry 0x%04x for timbre %d points to invalid timbre address 0x%04x", i, startTimbre, address);
			return false;
		}
		address += offset;
		if (compressed) {
			if (!initCompressedTimbre(startTimbre, &controlROMData[address], CONTROL_ROM_SIZE - address)) {
				printDebug("Control ROM error: Timbre map entry 0x%04x for timbre %d points to invalid timbre at 0x%04x", i, startTimbre, address);
				return false;
			}
		} else {
			timbresMemoryRegion->write(startTimbre, 0, &controlROMData[address], sizeof(TimbreParam), true);
		}
		startTimbre++;
	}
	return true;
}